

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O3

void __thiscall embree::LineSegments::commit(LineSegments *this)

{
  byte *pbVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  Device *pDVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  size_t sVar13;
  undefined3 uVar14;
  Buffer *pBVar15;
  char *pcVar16;
  ulong uVar17;
  undefined8 *puVar18;
  bool bVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  size_t sVar24;
  char cVar25;
  bool bVar26;
  Ref<embree::Buffer> buffer;
  Ref<embree::Buffer> local_50;
  long local_48;
  
  uVar20 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar20 != 0) {
    pBVar3 = (this->vertices).items;
    lVar23 = 0;
    do {
      if (*(int *)((long)&(pBVar3->super_RawBufferView).stride + lVar23) !=
          (int)(pBVar3->super_RawBufferView).stride) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_50.ptr = (Buffer *)&stack0xffffffffffffffc0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "stride of vertex buffers have to be identical for each time step","");
        *puVar18 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar18 + 1) = 3;
        puVar18[2] = puVar18 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar18 + 2),local_50.ptr,
                   (undefined1 *)((long)&((local_50.ptr)->super_RefCount)._vptr_RefCount + local_48)
                  );
        __cxa_throw(puVar18,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar23 = lVar23 + 0x38;
    } while (uVar20 * 0x38 - lVar23 != 0);
  }
  sVar24 = (this->normals).size_active;
  if (sVar24 != 0) {
    pBVar4 = (this->normals).items;
    lVar23 = 0;
    do {
      if (*(int *)((long)&(pBVar4->super_RawBufferView).stride + lVar23) !=
          (int)(pBVar4->super_RawBufferView).stride) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_50.ptr = (Buffer *)&stack0xffffffffffffffc0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "stride of normal buffers have to be identical for each time step","");
        *puVar18 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar18 + 1) = 3;
        puVar18[2] = puVar18 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar18 + 2),local_50.ptr,
                   (undefined1 *)((long)&((local_50.ptr)->super_RefCount)._vptr_RefCount + local_48)
                  );
        __cxa_throw(puVar18,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar23 = lVar23 + 0x38;
    } while (sVar24 * 0x38 - lVar23 != 0);
  }
  pBVar3 = (this->vertices).items;
  uVar6 = *(undefined4 *)&(pBVar3->super_RawBufferView).ptr_ofs;
  uVar7 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + 4);
  uVar8 = *(undefined4 *)&(pBVar3->super_RawBufferView).dptr_ofs;
  uVar9 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).dptr_ofs + 4);
  sVar24 = (pBVar3->super_RawBufferView).stride;
  uVar10 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).stride + 4);
  sVar13 = (pBVar3->super_RawBufferView).num;
  uVar11 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).num + 4);
  uVar2 = (pBVar3->super_RawBufferView).modCounter;
  bVar19 = (pBVar3->super_RawBufferView).modified;
  uVar14 = *(undefined3 *)&(pBVar3->super_RawBufferView).field_0x29;
  iVar12 = (pBVar3->super_RawBufferView).userData;
  (this->vertices0).super_RawBufferView.format = (pBVar3->super_RawBufferView).format;
  (this->vertices0).super_RawBufferView.modCounter = uVar2;
  (this->vertices0).super_RawBufferView.modified = bVar19;
  *(undefined3 *)&(this->vertices0).super_RawBufferView.field_0x29 = uVar14;
  (this->vertices0).super_RawBufferView.userData = iVar12;
  *(int *)&(this->vertices0).super_RawBufferView.stride = (int)sVar24;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.stride + 4) = uVar10;
  *(int *)&(this->vertices0).super_RawBufferView.num = (int)sVar13;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.num + 4) = uVar11;
  *(undefined4 *)&(this->vertices0).super_RawBufferView.ptr_ofs = uVar6;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.ptr_ofs + 4) = uVar7;
  *(undefined4 *)&(this->vertices0).super_RawBufferView.dptr_ofs = uVar8;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.dptr_ofs + 4) = uVar9;
  pBVar15 = (pBVar3->super_RawBufferView).buffer.ptr;
  if (pBVar15 != (Buffer *)0x0) {
    (*(pBVar15->super_RefCount)._vptr_RefCount[2])();
  }
  pBVar15 = (this->vertices0).super_RawBufferView.buffer.ptr;
  if (pBVar15 != (Buffer *)0x0) {
    (*(pBVar15->super_RefCount)._vptr_RefCount[3])();
  }
  (this->vertices0).super_RawBufferView.buffer.ptr = (pBVar3->super_RawBufferView).buffer.ptr;
  if (((uint)(this->super_Geometry).field_8 & 3) == 2) {
    pBVar4 = (this->normals).items;
    uVar6 = *(undefined4 *)&(pBVar4->super_RawBufferView).ptr_ofs;
    uVar7 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + 4);
    uVar8 = *(undefined4 *)&(pBVar4->super_RawBufferView).dptr_ofs;
    uVar9 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).dptr_ofs + 4);
    sVar24 = (pBVar4->super_RawBufferView).stride;
    uVar10 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).stride + 4);
    sVar13 = (pBVar4->super_RawBufferView).num;
    uVar11 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).num + 4);
    uVar2 = (pBVar4->super_RawBufferView).modCounter;
    bVar19 = (pBVar4->super_RawBufferView).modified;
    uVar14 = *(undefined3 *)&(pBVar4->super_RawBufferView).field_0x29;
    iVar12 = (pBVar4->super_RawBufferView).userData;
    (this->normals0).super_RawBufferView.format = (pBVar4->super_RawBufferView).format;
    (this->normals0).super_RawBufferView.modCounter = uVar2;
    (this->normals0).super_RawBufferView.modified = bVar19;
    *(undefined3 *)&(this->normals0).super_RawBufferView.field_0x29 = uVar14;
    (this->normals0).super_RawBufferView.userData = iVar12;
    *(int *)&(this->normals0).super_RawBufferView.stride = (int)sVar24;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = uVar10;
    *(int *)&(this->normals0).super_RawBufferView.num = (int)sVar13;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.num + 4) = uVar11;
    *(undefined4 *)&(this->normals0).super_RawBufferView.ptr_ofs = uVar6;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = uVar7;
    *(undefined4 *)&(this->normals0).super_RawBufferView.dptr_ofs = uVar8;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = uVar9;
    pBVar15 = (pBVar4->super_RawBufferView).buffer.ptr;
    if (pBVar15 != (Buffer *)0x0) {
      (*(pBVar15->super_RefCount)._vptr_RefCount[2])();
    }
    pBVar15 = (this->normals0).super_RawBufferView.buffer.ptr;
    if (pBVar15 != (Buffer *)0x0) {
      (*(pBVar15->super_RefCount)._vptr_RefCount[3])();
    }
    (this->normals0).super_RawBufferView.buffer.ptr = (pBVar4->super_RawBufferView).buffer.ptr;
  }
  if ((this->flags).super_RawBufferView.buffer.ptr == (Buffer *)0x0) {
    (this->flags).super_RawBufferView.userData = 0;
    sVar24 = (size_t)(this->super_Geometry).numPrimitives;
LAB_009e5625:
    pBVar15 = (Buffer *)operator_new(0x30);
    pDVar5 = (this->super_Geometry).device;
    (pBVar15->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    (pBVar15->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Buffer_02185000;
    pBVar15->device = pDVar5;
    pBVar15->numBytes = sVar24;
    (*(pDVar5->super_State).super_RefCount._vptr_RefCount[2])();
    pcVar16 = Buffer::alloc(pBVar15,(void *)0x0,&pBVar15->shared,MALLOC);
    pBVar15->ptr = pcVar16;
    local_50.ptr = pBVar15;
    (*(pBVar15->super_RefCount)._vptr_RefCount[2])(pBVar15);
    RawBufferView::set(&(this->flags).super_RawBufferView,&local_50,0,1,
                       (ulong)(this->super_Geometry).numPrimitives,RTC_FORMAT_UCHAR);
    if (local_50.ptr != (Buffer *)0x0) {
      (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    cVar25 = (this->flags).super_RawBufferView.userData == 0;
  }
  else {
    if ((this->flags).super_RawBufferView.userData != 0) goto LAB_009e5761;
    sVar24 = (size_t)(this->super_Geometry).numPrimitives;
    if ((this->flags).super_RawBufferView.num != sVar24) goto LAB_009e5625;
    cVar25 = this->field_0x80;
  }
  if ((cVar25 != '\0') &&
     (uVar2 = (this->super_Geometry).numPrimitives, uVar20 = (ulong)uVar2, uVar2 != 0)) {
    uVar17 = 0;
    bVar19 = false;
    do {
      if (uVar17 == (int)uVar20 - 1) {
        (this->flags).super_RawBufferView.ptr_ofs[(this->flags).super_RawBufferView.stride * uVar17]
             = bVar19;
        bVar26 = false;
        bVar22 = 0;
      }
      else {
        lVar23 = *(long *)&(this->super_Geometry).field_0x58;
        bVar26 = *(int *)(lVar23 + *(long *)&this->field_0x68 * (uVar17 + 1)) ==
                 *(int *)(lVar23 + *(long *)&this->field_0x68 * uVar17) + 1;
        (this->flags).super_RawBufferView.ptr_ofs[(this->flags).super_RawBufferView.stride * uVar17]
             = bVar19;
        bVar22 = bVar26 * '\x02';
      }
      uVar21 = uVar17 + 1;
      pbVar1 = (byte *)((this->flags).super_RawBufferView.ptr_ofs +
                       uVar17 * (this->flags).super_RawBufferView.stride);
      *pbVar1 = *pbVar1 | bVar22;
      uVar20 = (ulong)(this->super_Geometry).numPrimitives;
      uVar17 = uVar21;
      bVar19 = bVar26;
    } while (uVar21 < uVar20);
  }
LAB_009e5761:
  this->field_0x80 = 0;
  Geometry::commit(&this->super_Geometry);
  return;
}

Assistant:

void LineSegments::commit() 
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t=0; t<numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of vertex buffers have to be identical for each time step");
      vertices[t].buffer->commitIfNeeded();
    }

    for (auto& buffer : normals) {
      if (buffer.getStride() != normals[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of normal buffers have to be identical for each time step");
      buffer.buffer->commitIfNeeded();
    }

    vertices0 = vertices[0];
    if (getCurveType() == GTY_SUBTYPE_ORIENTED_CURVE)
      normals0 = normals[0];

    /* if no flags buffer is specified we manage and calculate the flags buffer */
    if (!flags.buffer) flags.userData = 0; // to encode that we manage this buffer
    bool recompute_flags_buffer = segments.isLocalModified();

    /* resize flags buffer if number of primitives changed */
    if (!flags.userData && (!flags.buffer || flags.size() != numPrimitives))
    {
      Ref<Buffer> buffer = new Buffer(device, numPrimitives*sizeof(char), nullptr, nullptr);
      flags.set(buffer, 0, sizeof(char), numPrimitives, RTC_FORMAT_UCHAR);
      recompute_flags_buffer = true;
    }

    /* recalculate the flags buffer if index buffer got modified */
    if (!flags.userData && recompute_flags_buffer)
    {
      bool hasLeft = false;
      for (size_t i=0; i<numPrimitives; i++) {
        bool hasRight = (i==numPrimitives-1) ? false : segment(i+1) == segment(i)+1;
        flags[i]  = hasLeft  * RTC_CURVE_FLAG_NEIGHBOR_LEFT;
        flags[i] |= hasRight * RTC_CURVE_FLAG_NEIGHBOR_RIGHT;
        hasLeft = hasRight;
      }
      flags.buffer->commit();
    }

    if (recompute_flags_buffer) {
      segments.buffer->commit();
    }
    segments.clearLocalModified();

    Geometry::commit();
  }